

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

void socks_cf_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  int iVar1;
  int *piVar2;
  curl_socket_t sock_00;
  curl_socket_t sock;
  socks_state *sx;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  piVar2 = (int *)cf->ctx;
  if (((cf->field_0x24 & 1) == 0) && (piVar2 != (int *)0x0)) {
    sock_00 = Curl_conn_cf_get_socket(cf,data);
    iVar1 = *piVar2;
    if ((iVar1 == 4) || (((iVar1 == 8 || (iVar1 == 10)) || (iVar1 == 0xf || iVar1 == 0x10)))) {
      Curl_pollset_change(data,ps,sock_00,1,2);
    }
    else {
      Curl_pollset_change(data,ps,sock_00,2,1);
    }
  }
  return;
}

Assistant:

static void socks_cf_adjust_pollset(struct Curl_cfilter *cf,
                                     struct Curl_easy *data,
                                     struct easy_pollset *ps)
{
  struct socks_state *sx = cf->ctx;

  if(!cf->connected && sx) {
    /* If we are not connected, the filter below is and has nothing
     * to wait on, we determine what to wait for. */
    curl_socket_t sock = Curl_conn_cf_get_socket(cf, data);
    switch(sx->state) {
    case CONNECT_RESOLVING:
    case CONNECT_SOCKS_READ:
    case CONNECT_AUTH_READ:
    case CONNECT_REQ_READ:
    case CONNECT_REQ_READ_MORE:
      Curl_pollset_set_in_only(data, ps, sock);
      break;
    default:
      Curl_pollset_set_out_only(data, ps, sock);
      break;
    }
  }
}